

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_LookupTable(LookupTableForm4 LookupTable)

{
  uint8_t uVar1;
  byte bVar2;
  reference pvVar3;
  byte *pbVar4;
  reference pvVar5;
  reference pvVar6;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lookupTable;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  uint8_t in_stack_fffffffffffffda6;
  uint8_t in_stack_fffffffffffffda7;
  allocator_type *in_stack_fffffffffffffda8;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  size_type sVar7;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  value_type vVar8;
  uint32_t *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdf0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint32_t in_stack_fffffffffffffdf8;
  uint32_t in_stack_fffffffffffffdfc;
  Image *in_stack_fffffffffffffe00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined1 isAnyValue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uint32_t in_stack_fffffffffffffe30;
  value_type x;
  value_type vVar9;
  value_type vVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  undefined1 local_151;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  pair<unsigned_int,_unsigned_int> local_134;
  pair<unsigned_int,_unsigned_int> local_12c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_120;
  undefined4 local_108;
  undefined4 local_104;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8 [2];
  undefined1 local_a8 [96];
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffd9c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdb0,(uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,in_stack_fffffffffffffda6
            );
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffda8,
             (Image *)CONCAT17(in_stack_fffffffffffffda7,
                               CONCAT16(in_stack_fffffffffffffda6,
                                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                                                ))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1da5d5);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdb0,(uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffda8,in_stack_fffffffffffffda7,in_stack_fffffffffffffda6
            );
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffda8,
             (Image *)CONCAT17(in_stack_fffffffffffffda7,
                               CONCAT16(in_stack_fffffffffffffda6,
                                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                                                ))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1da619);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1da626);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1da633);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1da648);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
           in_stack_fffffffffffffdb8,(allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1da671);
  local_12c = Unit_Test::imageSize
                        ((Image *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  pvVar3 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_120,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar3,&local_12c);
  local_134 = Unit_Test::imageSize
                        ((Image *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  pvVar3 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](&local_120,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar3,&local_134);
  Unit_Test::generateRoi
            ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)in_stack_fffffffffffffe00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),in_stack_fffffffffffffdf0
             ,(uint32_t *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_100,0);
  Unit_Test::fillImage
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8,
             (uint32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
             (uint32_t)in_stack_fffffffffffffdf0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_151 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1da7bc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(value_type_conflict *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1da7ed);
  uVar1 = Unit_Test::intensityValue();
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_150,(ulong)*pbVar4);
  *pvVar5 = uVar1;
  uVar1 = Unit_Test::intensityValue();
  value = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  this_01 = &local_150;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (this_01,(ulong)*pbVar4);
  *pvVar5 = uVar1;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,0);
  x = *pvVar6;
  this_00 = &local_100;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  vVar9 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (local_e8,(size_type)value);
  vVar10 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(size_type)value);
  isAnyValue = (undefined1)((ulong)this_00 >> 0x38);
  (*local_8)(local_48,x,vVar9,local_a8,vVar10,*pvVar6,local_104,local_108,this_01);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1da967);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1da98d);
  sVar7 = 0;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_150,(ulong)*pbVar4);
  vVar8 = *pvVar5;
  this = &local_170;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,sVar7);
  *pvVar5 = vVar8;
  sVar7 = 1;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_150,(ulong)*pbVar4);
  vVar8 = *pvVar5;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,sVar7);
  *pvVar5 = vVar8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_e8,sVar7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_100,sVar7);
  bVar2 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(vVar10,vVar9),x,in_stack_fffffffffffffe30,
                     (uint32_t)((ulong)this_01 >> 0x20),(uint32_t)this_01,value,(bool)isAnyValue);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1daace);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1daadb);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form4_LookupTable(LookupTableForm4 LookupTable)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input  = uniformImage();
        PenguinV_Image::Image output = uniformImage();

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;

        std::vector < std::pair < uint32_t, uint32_t > > size( 2 );

        size[0] = imageSize( input );
        size[1] = imageSize( output );

        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        fillImage( input, roiX[0], roiY[0], roiWidth, roiHeight, intensity );

        std::vector < uint8_t > lookupTable( 256, 0 );

        lookupTable[intensity[0]] = intensityValue();
        lookupTable[intensity[1]] = intensityValue();

        LookupTable( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight, lookupTable );

        std::vector < uint8_t > normalized( 2 );

        normalized[0] = lookupTable[intensity[0]];
        normalized[1] = lookupTable[intensity[1]];

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, normalized );
    }